

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlHandle.cpp
# Opt level: O1

int __thiscall
curlpp::internal::CurlHandle::executeProgressFunctor
          (CurlHandle *this,double dltotal,double dlnow,double ultotal,double ulnow)

{
  FunctorImpl<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
  *pFVar1;
  int iVar2;
  CallbackExceptionBase *this_00;
  LogicError local_20;
  
  pFVar1 = (this->mProgressFunctor).mImpl._M_ptr;
  if (pFVar1 == (FunctorImpl<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
                 *)0x0) {
    this_00 = (CallbackExceptionBase *)operator_new(0x20);
    LogicError::LogicError(&local_20,"Null write functor");
    CallbackExceptionBase::CallbackExceptionBase(this_00);
    *(undefined ***)&this_00->super_RuntimeError = &PTR__CallbackException_00133c90;
    std::logic_error::logic_error((logic_error *)(this_00 + 1),&local_20.super_logic_error);
    *(undefined ***)&this_00[1].super_RuntimeError = &PTR__LogicError_00133948;
    if (this->mException != (CallbackExceptionBase *)0x0) {
      (**(code **)(*(long *)&this->mException->super_RuntimeError + 8))();
    }
    this->mException = this_00;
    LogicError::~LogicError(&local_20);
    iVar2 = 0x2a;
  }
  else {
    iVar2 = (**pFVar1->_vptr_FunctorImpl)();
  }
  return iVar2;
}

Assistant:

int
CurlHandle::executeProgressFunctor(double dltotal, 
																	 double dlnow, 
																	 double ultotal, 
																	 double ulnow)
{
	if (!mProgressFunctor)
	{
		setException(new CallbackException<curlpp::LogicError>(curlpp::LogicError("Null write functor")));
		return CURLE_ABORTED_BY_CALLBACK;
	}

	try
	{
		return mProgressFunctor(dltotal, dlnow, ultotal, ulnow);
	}

	catch(curlpp::CallbackExceptionBase * e)
	{
		setException(e);
	}

	catch(...)
	{
		setException(new CallbackException<curlpp::UnknowException>(curlpp::UnknowException()));
	}

	return CURLE_ABORTED_BY_CALLBACK;
}